

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_IndexedLineSet(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  DeadlyImportError *this_00;
  CX3DImporter_NodeElement_IndexedSet *this_01;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  byte local_101;
  CX3DImporter_NodeElement_IndexedSet *pCStack_100;
  bool close_found;
  CX3DImporter_NodeElement_IndexedSet *ne_alias;
  string local_f0;
  undefined4 local_d0;
  allocator local_c9;
  undefined1 local_c8 [8];
  string an;
  uint local_94;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  vector<int,_std::allocator<int>_> coordIndex;
  undefined1 local_68 [7];
  bool colorPerVertex;
  vector<int,_std::allocator<int>_> colorIndex;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &colorIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_68);
  coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&ne);
  _idx_end = (CX3DImporter_NodeElement_IndexedSet *)0x0;
  local_94 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_94 < iVar2; local_94 = local_94 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_94);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_c8,(char *)CONCAT44(extraout_var,iVar3),&local_c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c8,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_94);
      std::__cxx11::string::operator=
                ((string *)
                 &colorIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(char *)CONCAT44(extraout_var_00,iVar3))
      ;
      local_d0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c8,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_94);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        local_d0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c8,"bboxCenter");
        if (bVar1) {
          local_d0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_c8,"bboxSize");
          if (bVar1) {
            local_d0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_c8,"containerField");
            if (bVar1) {
              local_d0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c8,"colorIndex");
              if (bVar1) {
                XML_ReadNode_GetAttrVal_AsArrI32
                          (this,local_94,(vector<int,_std::allocator<int>_> *)local_68);
                local_d0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_c8,"colorPerVertex");
                if (bVar1) {
                  coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._7_1_ =
                       XML_ReadNode_GetAttrVal_AsBool(this,local_94);
                  local_d0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_c8,"coordIndex");
                  if (bVar1) {
                    XML_ReadNode_GetAttrVal_AsArrI32
                              (this,local_94,(vector<int,_std::allocator<int>_> *)&ne);
                    local_d0 = 4;
                  }
                  else {
                    Throw_IncorrectAttr(this,(string *)local_c8);
                    local_d0 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_c8);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_IndexedLineSet,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    sVar7 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&ne);
    if ((sVar7 < 2) ||
       ((pvVar8 = std::vector<int,_std::allocator<int>_>::back
                            ((vector<int,_std::allocator<int>_> *)&ne), *pvVar8 == -1 &&
        (sVar7 = std::vector<int,_std::allocator<int>_>::size
                           ((vector<int,_std::allocator<int>_> *)&ne), sVar7 < 3)))) {
      ne_alias._6_1_ = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f0,
                 "IndexedLineSet must contain not empty \"coordIndex\" attribute.",
                 (allocator *)((long)&ne_alias + 7));
      DeadlyImportError::DeadlyImportError(this_00,&local_f0);
      ne_alias._6_1_ = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this_01 = (CX3DImporter_NodeElement_IndexedSet *)operator_new(0xf0);
    CX3DImporter_NodeElement_IndexedSet::CX3DImporter_NodeElement_IndexedSet
              (this_01,ENET_IndexedLineSet,this->NodeElement_Cur);
    _idx_end = this_01;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID,
                 (string *)
                 &colorIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    pCStack_100 = _idx_end;
    std::vector<int,_std::allocator<int>_>::operator=
              (&_idx_end->ColorIndex,(vector<int,_std::allocator<int>_> *)local_68);
    pCStack_100->ColorPerVertex =
         (bool)(coordIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
    std::vector<int,_std::allocator<int>_>::operator=
              (&pCStack_100->CoordIndex,(vector<int,_std::allocator<int>_> *)&ne);
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) == 0) {
      ParseHelper_Node_Enter(this,(CX3DImporter_NodeElement *)_idx_end);
      local_101 = 0;
      do {
        do {
          while( true ) {
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])
                              ();
            if ((uVar4 & 1) == 0) goto LAB_00b31fce;
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])
                              ();
            if (iVar2 != 1) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_128,"Color",&local_129);
            bVar1 = XML_CheckNode_NameEqual(this,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            std::allocator<char>::~allocator((allocator<char> *)&local_129);
            if (bVar1) {
              ParseNode_Rendering_Color(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_150,"ColorRGBA",&local_151);
              bVar1 = XML_CheckNode_NameEqual(this,&local_150);
              std::__cxx11::string::~string((string *)&local_150);
              std::allocator<char>::~allocator((allocator<char> *)&local_151);
              if (bVar1) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_178,"Coordinate",&local_179);
                bVar1 = XML_CheckNode_NameEqual(this,&local_178);
                std::__cxx11::string::~string((string *)&local_178);
                std::allocator<char>::~allocator((allocator<char> *)&local_179);
                if (bVar1) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
                  if (!bVar1) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_1a0,"IndexedLineSet",&local_1a1);
                    XML_CheckNode_SkipUnsupported(this,&local_1a0);
                    std::__cxx11::string::~string((string *)&local_1a0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
                  }
                }
              }
            }
          }
          pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])()
          ;
        } while (iVar2 != 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1c8,"IndexedLineSet",&local_1c9);
        bVar1 = XML_CheckNode_NameEqual(this,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      } while (!bVar1);
      local_101 = 1;
LAB_00b31fce:
      if ((local_101 & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1f0,"IndexedLineSet",&local_1f1);
        Throw_CloseNotFound(this,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&ne);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  std::__cxx11::string::~string
            ((string *)
             &colorIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_IndexedLineSet()
{
    std::string use, def;
    std::vector<int32_t> colorIndex;
    bool colorPerVertex = true;
    std::vector<int32_t> coordIndex;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("colorIndex", colorIndex, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("coordIndex", coordIndex, XML_ReadNode_GetAttrVal_AsArrI32);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_IndexedLineSet, ne);
	}
	else
	{
		// check data
		if((coordIndex.size() < 2) || ((coordIndex.back() == (-1)) && (coordIndex.size() < 3)))
			throw DeadlyImportError("IndexedLineSet must contain not empty \"coordIndex\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_IndexedLineSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ne_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);

		ne_alias.ColorIndex = colorIndex;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.CoordIndex = coordIndex;
        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("IndexedLineSet");
				// check for Color and Coordinate nodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("IndexedLineSet");

			MACRO_NODECHECK_LOOPEND("IndexedLineSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}